

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

int scan_csv(Scanner *s,char *stop)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  byte local_21;
  uchar yych;
  char *stop_local;
  Scanner *s_local;
  
LAB_0010dfbc:
  if (stop <= s->cur) {
    return 0;
  }
  s->start = s->cur;
  switch(*s->cur) {
  case '\0':
    s->cur = s->cur + 1;
    return 4;
  case '\x01':
  case '\x02':
  case '\x03':
  case '\x04':
  case '\x05':
  case '\x06':
  case '\a':
  case '\v':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x14':
  case '\x15':
  case '\x16':
  case '\x17':
  case '\x18':
  case '\x19':
  case '\x1a':
  case '\x1b':
  case '\x1c':
  case '\x1d':
  case '\x1e':
  case '\x1f':
  case ' ':
  case '!':
  case '#':
  case '$':
  case '%':
  case '&':
  case '\'':
  case '(':
  case ')':
  case '*':
  case '+':
  case '/':
  case ':':
  case ';':
  case '<':
  case '=':
  case '>':
  case '?':
  case '@':
  case 'A':
  case 'B':
  case 'C':
  case 'D':
  case 'E':
  case 'F':
  case 'G':
  case 'H':
  case 'I':
  case 'J':
  case 'K':
  case 'L':
  case 'M':
  case 'N':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'S':
  case 'T':
  case 'U':
  case 'V':
  case 'W':
  case 'X':
  case 'Y':
  case 'Z':
  case '[':
  case ']':
  case '^':
  case '_':
  case '`':
  case 'a':
  case 'b':
  case 'c':
  case 'd':
  case 'e':
  case 'g':
  case 'h':
  case 'i':
  case 'j':
  case 'k':
  case 'l':
  case 'm':
  case 'n':
  case 'o':
  case 'p':
  case 'q':
  case 'r':
  case 's':
  case 'u':
  case 'v':
  case 'w':
  case 'x':
  case 'y':
  case 'z':
  case '{':
  case '|':
  case '}':
  case '~':
  case '\x7f':
    goto LAB_0010e278;
  case '\b':
    s->cur = s->cur + 1;
    return 2;
  case '\t':
    s->cur = s->cur + 1;
    return 2;
  case '\n':
    goto LAB_0010e176;
  case '\f':
    s->cur = s->cur + 1;
    return 2;
  case '\r':
    pcVar2 = s->cur;
    s->cur = pcVar2 + 1;
    if (pcVar2[1] != '\n') {
      return 3;
    }
LAB_0010e176:
    s->cur = s->cur + 1;
    return 3;
  case '\"':
    s->cur = s->cur + 1;
    if (*s->cur != '\"') {
      return 8;
    }
    s->cur = s->cur + 1;
    return 6;
  case ',':
    s->cur = s->cur + 1;
    return 5;
  case '-':
    goto LAB_0010e087;
  case '.':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    s->cur = s->cur + 1;
    local_21 = *s->cur;
    goto LAB_0010e4ce;
  case '\\':
    s->cur = s->cur + 1;
    return 2;
  case 'f':
    pcVar2 = s->cur;
    pcVar3 = pcVar2 + 1;
    s->cur = pcVar3;
    s->ptr = pcVar3;
    if (pcVar2[1] != 'a') goto LAB_0010dfbc;
    pcVar2 = s->cur;
    s->cur = pcVar2 + 1;
    if ((pcVar2[1] == 'l') && (pcVar2 = s->cur, s->cur = pcVar2 + 1, pcVar2[1] == 's')) {
      pcVar2 = s->cur;
      s->cur = pcVar2 + 1;
      cVar1 = pcVar2[1];
joined_r0x0010e4a6:
      if (cVar1 == 'e') {
        s->cur = s->cur + 1;
        return 7;
      }
    }
    break;
  case 't':
    pcVar2 = s->cur;
    pcVar3 = pcVar2 + 1;
    s->cur = pcVar3;
    s->ptr = pcVar3;
    if (pcVar2[1] != 'r') goto LAB_0010dfbc;
    pcVar2 = s->cur;
    s->cur = pcVar2 + 1;
    if (pcVar2[1] == 'u') {
      pcVar2 = s->cur;
      s->cur = pcVar2 + 1;
      cVar1 = pcVar2[1];
      goto joined_r0x0010e4a6;
    }
    break;
  default:
    break;
  case -0x3e:
  case -0x3d:
  case -0x3c:
  case -0x3b:
  case -0x3a:
  case -0x39:
  case -0x38:
  case -0x37:
  case -0x36:
  case -0x35:
  case -0x34:
  case -0x33:
  case -0x32:
  case -0x31:
  case -0x30:
  case -0x2f:
  case -0x2e:
  case -0x2d:
  case -0x2c:
  case -0x2b:
  case -0x2a:
  case -0x29:
  case -0x28:
  case -0x27:
  case -0x26:
  case -0x25:
  case -0x24:
  case -0x23:
  case -0x22:
  case -0x21:
LAB_0010e296:
    pcVar2 = s->cur;
    s->cur = pcVar2 + 1;
    if (0x3f < (byte)pcVar2[1] - 0x80) break;
LAB_0010e278:
    s->cur = s->cur + 1;
    goto LAB_0010dfbc;
  case -0x20:
    pcVar2 = s->cur;
    s->cur = pcVar2 + 1;
    if ((byte)pcVar2[1] - 0xa0 < 0x20) goto LAB_0010e296;
    break;
  case -0x1f:
  case -0x1e:
  case -0x1d:
  case -0x1c:
  case -0x1b:
  case -0x1a:
  case -0x19:
  case -0x18:
  case -0x17:
  case -0x16:
  case -0x15:
  case -0x14:
  case -0x13:
  case -0x12:
  case -0x11:
LAB_0010e2f2:
    pcVar2 = s->cur;
    s->cur = pcVar2 + 1;
    if ((byte)pcVar2[1] - 0x80 < 0x40) goto LAB_0010e296;
    break;
  case -0x10:
    pcVar2 = s->cur;
    s->cur = pcVar2 + 1;
    if ((byte)pcVar2[1] - 0x90 < 0x30) goto LAB_0010e2f2;
    break;
  case -0xf:
  case -0xe:
  case -0xd:
    pcVar2 = s->cur;
    s->cur = pcVar2 + 1;
    if ((byte)pcVar2[1] - 0x80 < 0x40) goto LAB_0010e2f2;
    break;
  case -0xc:
    pcVar2 = s->cur;
    s->cur = pcVar2 + 1;
    if ((byte)pcVar2[1] - 0x80 < 0x10) goto LAB_0010e2f2;
  }
  s->cur = s->ptr;
  goto LAB_0010dfbc;
LAB_0010e087:
  s->cur = s->cur + 1;
  if (((byte)*s->cur == 0x2e) || ((byte)*s->cur - 0x30 < 10)) {
    do {
      s->cur = s->cur + 1;
      local_21 = *s->cur;
LAB_0010e4ce:
    } while ((local_21 == 0x2e) || (local_21 - 0x30 < 10));
    return 7;
  }
  goto LAB_0010dfbc;
}

Assistant:

int scan_csv(Scanner * s, const char * stop) {

scan:

	if (s->cur >= stop) {
		return 0;
	}

	s->start = s->cur;


	{
		YYCTYPE yych;
		yych = *YYCURSOR;

		switch (yych) {
			case 0x00:
				goto yy9;

			case 0x01:
			case 0x02:
			case 0x03:
			case 0x04:
			case 0x05:
			case 0x06:
			case 0x07:
			case '\v':
			case 0x0E:
			case 0x0F:
			case 0x10:
			case 0x11:
			case 0x12:
			case 0x13:
			case 0x14:
			case 0x15:
			case 0x16:
			case 0x17:
			case 0x18:
			case 0x19:
			case 0x1A:
			case 0x1B:
			case 0x1C:
			case 0x1D:
			case 0x1E:
			case 0x1F:
			case ' ':
			case '!':
			case '#':
			case '$':
			case '%':
			case '&':
			case '\'':
			case '(':
			case ')':
			case '*':
			case '+':
			case '/':
			case ':':
			case ';':
			case '<':
			case '=':
			case '>':
			case '?':
			case '@':
			case 'A':
			case 'B':
			case 'C':
			case 'D':
			case 'E':
			case 'F':
			case 'G':
			case 'H':
			case 'I':
			case 'J':
			case 'K':
			case 'L':
			case 'M':
			case 'N':
			case 'O':
			case 'P':
			case 'Q':
			case 'R':
			case 'S':
			case 'T':
			case 'U':
			case 'V':
			case 'W':
			case 'X':
			case 'Y':
			case 'Z':
			case '[':
			case ']':
			case '^':
			case '_':
			case '`':
			case 'a':
			case 'b':
			case 'c':
			case 'd':
			case 'e':
			case 'g':
			case 'h':
			case 'i':
			case 'j':
			case 'k':
			case 'l':
			case 'm':
			case 'n':
			case 'o':
			case 'p':
			case 'q':
			case 'r':
			case 's':
			case 'u':
			case 'v':
			case 'w':
			case 'x':
			case 'y':
			case 'z':
			case '{':
			case '|':
			case '}':
			case '~':
			case 0x7F:
				goto yy26;

			case 0x08:
				goto yy22;

			case '\t':
				goto yy20;

			case '\n':
				goto yy11;

			case '\f':
				goto yy24;

			case '\r':
				goto yy13;

			case '"':
				goto yy16;

			case ',':
				goto yy14;

			case '-':
				goto yy3;

			case '.':
			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case '8':
			case '9':
				goto yy5;

			case '\\':
				goto yy18;

			case 'f':
				goto yy8;

			case 't':
				goto yy7;

			case 0xC2:
			case 0xC3:
			case 0xC4:
			case 0xC5:
			case 0xC6:
			case 0xC7:
			case 0xC8:
			case 0xC9:
			case 0xCA:
			case 0xCB:
			case 0xCC:
			case 0xCD:
			case 0xCE:
			case 0xCF:
			case 0xD0:
			case 0xD1:
			case 0xD2:
			case 0xD3:
			case 0xD4:
			case 0xD5:
			case 0xD6:
			case 0xD7:
			case 0xD8:
			case 0xD9:
			case 0xDA:
			case 0xDB:
			case 0xDC:
			case 0xDD:
			case 0xDE:
			case 0xDF:
				goto yy27;

			case 0xE0:
				goto yy28;

			case 0xE1:
			case 0xE2:
			case 0xE3:
			case 0xE4:
			case 0xE5:
			case 0xE6:
			case 0xE7:
			case 0xE8:
			case 0xE9:
			case 0xEA:
			case 0xEB:
			case 0xEC:
			case 0xED:
			case 0xEE:
			case 0xEF:
				goto yy29;

			case 0xF0:
				goto yy30;

			case 0xF1:
			case 0xF2:
			case 0xF3:
				goto yy31;

			case 0xF4:
				goto yy32;

			default:
				goto yy2;
		}

yy2:
		YYCURSOR = YYMARKER;
		goto yy4;
yy3:
		++YYCURSOR;

		switch ((yych = *YYCURSOR)) {
			case '.':
			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case '8':
			case '9':
				goto yy42;

			default:
				goto yy4;
		}

yy4: {
			goto scan;
		}
yy5:
		++YYCURSOR;
		yych = *YYCURSOR;
		goto yy43;
yy6: {
			return TEXT_NUMERIC;
		}
yy7:
		yych = *(YYMARKER = ++YYCURSOR);

		switch (yych) {
			case 'r':
				goto yy40;

			default:
				goto yy4;
		}

yy8:
		yych = *(YYMARKER = ++YYCURSOR);

		switch (yych) {
			case 'a':
				goto yy35;

			default:
				goto yy4;
		}

yy9:
		++YYCURSOR;
		{
			return TDP_EOF;
		}
yy11:
		++YYCURSOR;
yy12: {
			return RECORD_DELIMITER;
		}
yy13:
		yych = *++YYCURSOR;

		switch (yych) {
			case '\n':
				goto yy11;

			default:
				goto yy12;
		}

yy14:
		++YYCURSOR;
		{
			return FIELD_DELIMITER;
		}
yy16:
		++YYCURSOR;

		switch ((yych = *YYCURSOR)) {
			case '"':
				goto yy33;

			default:
				goto yy17;
		}

yy17: {
			return ESCAPE;
		}
yy18:
		++YYCURSOR;
		{
			return NEEDS_ESCAPE;
		}
yy20:
		++YYCURSOR;
		{
			return NEEDS_ESCAPE;
		}
yy22:
		++YYCURSOR;
		{
			return NEEDS_ESCAPE;
		}
yy24:
		++YYCURSOR;
		{
			return NEEDS_ESCAPE;
		}
yy26:
		yych = *++YYCURSOR;
		goto yy4;
yy27:
		yych = *++YYCURSOR;

		switch (yych) {
			case 0x80:
			case 0x81:
			case 0x82:
			case 0x83:
			case 0x84:
			case 0x85:
			case 0x86:
			case 0x87:
			case 0x88:
			case 0x89:
			case 0x8A:
			case 0x8B:
			case 0x8C:
			case 0x8D:
			case 0x8E:
			case 0x8F:
			case 0x90:
			case 0x91:
			case 0x92:
			case 0x93:
			case 0x94:
			case 0x95:
			case 0x96:
			case 0x97:
			case 0x98:
			case 0x99:
			case 0x9A:
			case 0x9B:
			case 0x9C:
			case 0x9D:
			case 0x9E:
			case 0x9F:
			case 0xA0:
			case 0xA1:
			case 0xA2:
			case 0xA3:
			case 0xA4:
			case 0xA5:
			case 0xA6:
			case 0xA7:
			case 0xA8:
			case 0xA9:
			case 0xAA:
			case 0xAB:
			case 0xAC:
			case 0xAD:
			case 0xAE:
			case 0xAF:
			case 0xB0:
			case 0xB1:
			case 0xB2:
			case 0xB3:
			case 0xB4:
			case 0xB5:
			case 0xB6:
			case 0xB7:
			case 0xB8:
			case 0xB9:
			case 0xBA:
			case 0xBB:
			case 0xBC:
			case 0xBD:
			case 0xBE:
			case 0xBF:
				goto yy26;

			default:
				goto yy2;
		}

yy28:
		yych = *++YYCURSOR;

		switch (yych) {
			case 0xA0:
			case 0xA1:
			case 0xA2:
			case 0xA3:
			case 0xA4:
			case 0xA5:
			case 0xA6:
			case 0xA7:
			case 0xA8:
			case 0xA9:
			case 0xAA:
			case 0xAB:
			case 0xAC:
			case 0xAD:
			case 0xAE:
			case 0xAF:
			case 0xB0:
			case 0xB1:
			case 0xB2:
			case 0xB3:
			case 0xB4:
			case 0xB5:
			case 0xB6:
			case 0xB7:
			case 0xB8:
			case 0xB9:
			case 0xBA:
			case 0xBB:
			case 0xBC:
			case 0xBD:
			case 0xBE:
			case 0xBF:
				goto yy27;

			default:
				goto yy2;
		}

yy29:
		yych = *++YYCURSOR;

		switch (yych) {
			case 0x80:
			case 0x81:
			case 0x82:
			case 0x83:
			case 0x84:
			case 0x85:
			case 0x86:
			case 0x87:
			case 0x88:
			case 0x89:
			case 0x8A:
			case 0x8B:
			case 0x8C:
			case 0x8D:
			case 0x8E:
			case 0x8F:
			case 0x90:
			case 0x91:
			case 0x92:
			case 0x93:
			case 0x94:
			case 0x95:
			case 0x96:
			case 0x97:
			case 0x98:
			case 0x99:
			case 0x9A:
			case 0x9B:
			case 0x9C:
			case 0x9D:
			case 0x9E:
			case 0x9F:
			case 0xA0:
			case 0xA1:
			case 0xA2:
			case 0xA3:
			case 0xA4:
			case 0xA5:
			case 0xA6:
			case 0xA7:
			case 0xA8:
			case 0xA9:
			case 0xAA:
			case 0xAB:
			case 0xAC:
			case 0xAD:
			case 0xAE:
			case 0xAF:
			case 0xB0:
			case 0xB1:
			case 0xB2:
			case 0xB3:
			case 0xB4:
			case 0xB5:
			case 0xB6:
			case 0xB7:
			case 0xB8:
			case 0xB9:
			case 0xBA:
			case 0xBB:
			case 0xBC:
			case 0xBD:
			case 0xBE:
			case 0xBF:
				goto yy27;

			default:
				goto yy2;
		}

yy30:
		yych = *++YYCURSOR;

		switch (yych) {
			case 0x90:
			case 0x91:
			case 0x92:
			case 0x93:
			case 0x94:
			case 0x95:
			case 0x96:
			case 0x97:
			case 0x98:
			case 0x99:
			case 0x9A:
			case 0x9B:
			case 0x9C:
			case 0x9D:
			case 0x9E:
			case 0x9F:
			case 0xA0:
			case 0xA1:
			case 0xA2:
			case 0xA3:
			case 0xA4:
			case 0xA5:
			case 0xA6:
			case 0xA7:
			case 0xA8:
			case 0xA9:
			case 0xAA:
			case 0xAB:
			case 0xAC:
			case 0xAD:
			case 0xAE:
			case 0xAF:
			case 0xB0:
			case 0xB1:
			case 0xB2:
			case 0xB3:
			case 0xB4:
			case 0xB5:
			case 0xB6:
			case 0xB7:
			case 0xB8:
			case 0xB9:
			case 0xBA:
			case 0xBB:
			case 0xBC:
			case 0xBD:
			case 0xBE:
			case 0xBF:
				goto yy29;

			default:
				goto yy2;
		}

yy31:
		yych = *++YYCURSOR;

		switch (yych) {
			case 0x80:
			case 0x81:
			case 0x82:
			case 0x83:
			case 0x84:
			case 0x85:
			case 0x86:
			case 0x87:
			case 0x88:
			case 0x89:
			case 0x8A:
			case 0x8B:
			case 0x8C:
			case 0x8D:
			case 0x8E:
			case 0x8F:
			case 0x90:
			case 0x91:
			case 0x92:
			case 0x93:
			case 0x94:
			case 0x95:
			case 0x96:
			case 0x97:
			case 0x98:
			case 0x99:
			case 0x9A:
			case 0x9B:
			case 0x9C:
			case 0x9D:
			case 0x9E:
			case 0x9F:
			case 0xA0:
			case 0xA1:
			case 0xA2:
			case 0xA3:
			case 0xA4:
			case 0xA5:
			case 0xA6:
			case 0xA7:
			case 0xA8:
			case 0xA9:
			case 0xAA:
			case 0xAB:
			case 0xAC:
			case 0xAD:
			case 0xAE:
			case 0xAF:
			case 0xB0:
			case 0xB1:
			case 0xB2:
			case 0xB3:
			case 0xB4:
			case 0xB5:
			case 0xB6:
			case 0xB7:
			case 0xB8:
			case 0xB9:
			case 0xBA:
			case 0xBB:
			case 0xBC:
			case 0xBD:
			case 0xBE:
			case 0xBF:
				goto yy29;

			default:
				goto yy2;
		}

yy32:
		yych = *++YYCURSOR;

		switch (yych) {
			case 0x80:
			case 0x81:
			case 0x82:
			case 0x83:
			case 0x84:
			case 0x85:
			case 0x86:
			case 0x87:
			case 0x88:
			case 0x89:
			case 0x8A:
			case 0x8B:
			case 0x8C:
			case 0x8D:
			case 0x8E:
			case 0x8F:
				goto yy29;

			default:
				goto yy2;
		}

yy33:
		++YYCURSOR;
		{
			return ESCAPED_ESCAPE;
		}
yy35:
		yych = *++YYCURSOR;

		switch (yych) {
			case 'l':
				goto yy36;

			default:
				goto yy2;
		}

yy36:
		yych = *++YYCURSOR;

		switch (yych) {
			case 's':
				goto yy37;

			default:
				goto yy2;
		}

yy37:
		yych = *++YYCURSOR;

		switch (yych) {
			case 'e':
				goto yy38;

			default:
				goto yy2;
		}

yy38:
		++YYCURSOR;
		{
			return TEXT_NUMERIC;
		}
yy40:
		yych = *++YYCURSOR;

		switch (yych) {
			case 'u':
				goto yy41;

			default:
				goto yy2;
		}

yy41:
		yych = *++YYCURSOR;

		switch (yych) {
			case 'e':
				goto yy38;

			default:
				goto yy2;
		}

yy42:
		++YYCURSOR;
		yych = *YYCURSOR;
yy43:

		switch (yych) {
			case '.':
			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case '8':
			case '9':
				goto yy42;

			default:
				goto yy6;
		}
	}

}